

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheetFactory.cpp
# Opt level: O2

void __thiscall Rml::StyleSheetFactory::StyleSheetFactory(StyleSheetFactory *this)

{
  size_t *psVar1;
  long lVar2;
  initializer_list<robin_hood::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType>_>
  initlist;
  equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_266;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_265;
  StructuralSelectorType local_264 [13];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType>
  local_230;
  pair<std::__cxx11::string,Rml::StructuralSelectorType> local_208 [40];
  pair<std::__cxx11::string,Rml::StructuralSelectorType> local_1e0 [40];
  pair<std::__cxx11::string,Rml::StructuralSelectorType> local_1b8 [40];
  pair<std::__cxx11::string,Rml::StructuralSelectorType> local_190 [40];
  pair<std::__cxx11::string,Rml::StructuralSelectorType> local_168 [40];
  pair<std::__cxx11::string,Rml::StructuralSelectorType> local_140 [40];
  pair<std::__cxx11::string,Rml::StructuralSelectorType> local_118 [40];
  pair<std::__cxx11::string,Rml::StructuralSelectorType> local_f0 [40];
  pair<std::__cxx11::string,Rml::StructuralSelectorType> local_c8 [40];
  pair<std::__cxx11::string,Rml::StructuralSelectorType> local_a0 [40];
  pair<std::__cxx11::string,Rml::StructuralSelectorType> local_78 [40];
  pair<std::__cxx11::string,Rml::StructuralSelectorType> local_50 [40];
  
  psVar1 = &(this->stylesheets).mMask;
  (this->stylesheets).mKeyVals = (Node *)psVar1;
  (this->stylesheets).mInfo = (uint8_t *)psVar1;
  (this->stylesheets).mMaxNumElementsAllowed = 0;
  (this->stylesheets).mNumElements = 0;
  (this->stylesheets).mMask = 0;
  (this->stylesheets).mInfoInc = 0x20;
  (this->stylesheets).mInfoHashShift = 0;
  local_264[0xc] = 1;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[10],Rml::StructuralSelectorType>
            ((pair<std::__cxx11::string,Rml::StructuralSelectorType> *)&local_230,
             (char (*) [10])"nth-child",local_264 + 0xc);
  local_264[0xb] = 2;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[15],Rml::StructuralSelectorType>
            (local_208,(char (*) [15])"nth-last-child",local_264 + 0xb);
  local_264[10] = 3;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[12],Rml::StructuralSelectorType>
            (local_1e0,(char (*) [12])"nth-of-type",local_264 + 10);
  local_264[9] = 4;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[17],Rml::StructuralSelectorType>
            (local_1b8,(char (*) [17])"nth-last-of-type",local_264 + 9);
  local_264[8] = 5;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[12],Rml::StructuralSelectorType>
            (local_190,(char (*) [12])"first-child",local_264 + 8);
  local_264[7] = 6;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[11],Rml::StructuralSelectorType>
            (local_168,(char (*) [11])0x32508c,local_264 + 7);
  local_264[6] = 7;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[14],Rml::StructuralSelectorType>
            (local_140,(char (*) [14])"first-of-type",local_264 + 6);
  local_264[5] = 8;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[13],Rml::StructuralSelectorType>
            (local_118,(char (*) [13])0x3250a7,local_264 + 5);
  local_264[4] = 9;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[11],Rml::StructuralSelectorType>
            (local_f0,(char (*) [11])"only-child",local_264 + 4);
  local_264[3] = 10;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[13],Rml::StructuralSelectorType>
            (local_c8,(char (*) [13])"only-of-type",local_264 + 3);
  local_264[2] = 0xb;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[6],Rml::StructuralSelectorType>(local_a0,(char (*) [6])"empty",local_264 + 2);
  local_264[1] = 0xc;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[4],Rml::StructuralSelectorType>(local_78,(char (*) [4])0x31fa34,local_264 + 1);
  local_264[0] = Scope;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[6],Rml::StructuralSelectorType>(local_50,(char (*) [6])"scope",local_264);
  initlist._M_len = 0xd;
  initlist._M_array = &local_230;
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Table(&this->selectors,initlist,0,&local_265,&local_266);
  lVar2 = 0x1e0;
  do {
    ::std::__cxx11::string::~string((string *)((long)&local_230.first._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x28);
  return;
}

Assistant:

StyleSheetFactory::StyleSheetFactory() :
	selectors{
		{"nth-child", StructuralSelectorType::Nth_Child},
		{"nth-last-child", StructuralSelectorType::Nth_Last_Child},
		{"nth-of-type", StructuralSelectorType::Nth_Of_Type},
		{"nth-last-of-type", StructuralSelectorType::Nth_Last_Of_Type},
		{"first-child", StructuralSelectorType::First_Child},
		{"last-child", StructuralSelectorType::Last_Child},
		{"first-of-type", StructuralSelectorType::First_Of_Type},
		{"last-of-type", StructuralSelectorType::Last_Of_Type},
		{"only-child", StructuralSelectorType::Only_Child},
		{"only-of-type", StructuralSelectorType::Only_Of_Type},
		{"empty", StructuralSelectorType::Empty},
		{"not", StructuralSelectorType::Not},
		{"scope", StructuralSelectorType::Scope},
	}
{}